

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# api.c
# Opt level: O0

ufile_error ufile_load_config_from_json(char *json_buf,ufile_config *cfg)

{
  ufile_config cfg_00;
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  int iVar4;
  cJSON *item_00;
  char *pcVar5;
  ufile_error uVar6;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  cJSON *local_38;
  cJSON *item;
  cJSON *json;
  ufile_config *cfg_local;
  char *json_buf_local;
  ufile_error error;
  
  item_00 = cJSON_Parse(json_buf);
  if (item_00 == (cJSON *)0x0) {
    json_buf_local = (char *)0xfffffffe;
    error._0_8_ = cJSON_GetErrorPtr();
  }
  else {
    for (local_38 = item_00->child; local_38 != (cJSON *)0x0; local_38 = local_38->next) {
      iVar4 = strcmp(local_38->string,"public_key");
      if (iVar4 == 0) {
        pcVar5 = ufile_strconcat(local_38->valuestring,0);
        cfg->public_key = pcVar5;
      }
      else {
        iVar4 = strcmp(local_38->string,"private_key");
        if (iVar4 == 0) {
          pcVar5 = ufile_strconcat(local_38->valuestring,0);
          cfg->private_key = pcVar5;
        }
        else {
          iVar4 = strcmp(local_38->string,"file_host");
          if (iVar4 == 0) {
            pcVar5 = ufile_strconcat(local_38->valuestring,0);
            cfg->file_host = pcVar5;
          }
          else {
            iVar4 = strcmp(local_38->string,"bucket_host");
            if (iVar4 == 0) {
              pcVar5 = ufile_strconcat(local_38->valuestring,0);
              cfg->bucket_host = pcVar5;
            }
          }
        }
      }
    }
    cJSON_Delete(item_00);
    uVar1 = cfg->private_key;
    uVar2 = cfg->file_host;
    uVar3 = cfg->bucket_host;
    cfg_00.file_host = (char *)uVar3;
    cfg_00.private_key = (char *)uVar2;
    cfg_00.public_key = (char *)uVar1;
    cfg_00.bucket_host._0_4_ = in_stack_ffffffffffffffb8;
    cfg_00.bucket_host._4_4_ = in_stack_ffffffffffffffbc;
    uVar6 = config_validation(cfg_00);
    error._0_8_ = uVar6.message;
    json_buf_local = (char *)(ulong)(uint)uVar6.code;
  }
  uVar6.message = (char *)error._0_8_;
  uVar6._0_8_ = json_buf_local;
  return uVar6;
}

Assistant:

struct ufile_error
ufile_load_config_from_json(const char* json_buf, struct ufile_config *cfg){
    struct ufile_error error = NO_ERROR;
    struct cJSON *json = cJSON_Parse(json_buf); 
    if(json==NULL){
        error.code = UFILE_CONFIG_ERROR_CODE;
        error.message = cJSON_GetErrorPtr();
        return error;
    }
    struct cJSON *item = json->child;
    while(item!=NULL){
        if (strcmp(item->string, "public_key") == 0){
            cfg->public_key = ufile_strconcat(item->valuestring,NULL);
        }else if(strcmp(item->string,"private_key") == 0){
            cfg->private_key = ufile_strconcat(item->valuestring, NULL);
        }else if(strcmp(item->string,"file_host") == 0){
            cfg->file_host = ufile_strconcat(item->valuestring, NULL);
        }else if(strcmp(item->string,"bucket_host") == 0){
            cfg->bucket_host = ufile_strconcat(item->valuestring, NULL);
        }
        item = item->next;
    }
    cJSON_Delete(json);
    error = config_validation(*cfg);
    return error;
}